

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication_p.h
# Opt level: O1

QGestureManager * QGestureManager::instance(InstanceCreation ic)

{
  QApplicationPrivate *pQVar1;
  QGestureManager *pQVar2;
  
  pQVar1 = QApplicationPrivate::self;
  if (QApplicationPrivate::self == (QApplicationPrivate *)0x0) {
    pQVar2 = (QGestureManager *)0x0;
  }
  else {
    if ((ic == ForceCreation) &&
       (QApplicationPrivate::self->gestureManager == (QGestureManager *)0x0)) {
      pQVar2 = (QGestureManager *)operator_new(0x68);
      QGestureManager((QGestureManager *)pQVar2,QCoreApplication::self);
      pQVar1->gestureManager = pQVar2;
    }
    pQVar2 = pQVar1->gestureManager;
  }
  return pQVar2;
}

Assistant:

static QApplicationPrivate *instance() { return self; }